

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O0

void xmlSAX2EntityDecl(void *ctx,xmlChar *name,int type,xmlChar *publicId,xmlChar *systemId,
                      xmlChar *content)

{
  xmlEntityPtr pxVar1;
  xmlChar *pxVar2;
  xmlChar *local_68;
  char *base_1;
  xmlChar *URI_1;
  char *base;
  xmlChar *URI;
  xmlParserCtxtPtr ctxt;
  xmlEntityPtr ent;
  xmlChar *content_local;
  xmlChar *systemId_local;
  xmlChar *publicId_local;
  int type_local;
  xmlChar *name_local;
  void *ctx_local;
  
  if (ctx != (void *)0x0) {
    if (*(int *)((long)ctx + 0x150) == 1) {
      pxVar1 = xmlAddDocEntity(*(xmlDocPtr *)((long)ctx + 0x10),name,type,publicId,systemId,content)
      ;
      if ((pxVar1 == (xmlEntityPtr)0x0) && (*(int *)((long)ctx + 0x1a4) != 0)) {
        xmlWarnMsg((xmlParserCtxtPtr)ctx,XML_WAR_ENTITY_REDEFINED,
                   "Entity(%s) already defined in the internal subset\n",name);
      }
      if (((pxVar1 != (xmlEntityPtr)0x0) && (pxVar1->URI == (xmlChar *)0x0)) &&
         (systemId != (xmlChar *)0x0)) {
        URI_1 = (xmlChar *)0x0;
        if (*(long *)((long)ctx + 0x38) != 0) {
          URI_1 = *(xmlChar **)(*(long *)((long)ctx + 0x38) + 8);
        }
        if (URI_1 == (xmlChar *)0x0) {
          URI_1 = *(xmlChar **)((long)ctx + 0x118);
        }
        pxVar2 = xmlBuildURI(systemId,URI_1);
        pxVar1->URI = pxVar2;
      }
    }
    else if (*(int *)((long)ctx + 0x150) == 2) {
      pxVar1 = xmlAddDtdEntity(*(xmlDocPtr *)((long)ctx + 0x10),name,type,publicId,systemId,content)
      ;
      if ((((pxVar1 == (xmlEntityPtr)0x0) && (*(int *)((long)ctx + 0x1a4) != 0)) && (*ctx != 0)) &&
         (*(long *)(*ctx + 0xa8) != 0)) {
        (**(code **)(*ctx + 0xa8))
                  (*(undefined8 *)((long)ctx + 8),
                   "Entity(%s) already defined in the external subset\n",name);
      }
      if (((pxVar1 != (xmlEntityPtr)0x0) && (pxVar1->URI == (xmlChar *)0x0)) &&
         (systemId != (xmlChar *)0x0)) {
        local_68 = (xmlChar *)0x0;
        if (*(long *)((long)ctx + 0x38) != 0) {
          local_68 = *(xmlChar **)(*(long *)((long)ctx + 0x38) + 8);
        }
        if (local_68 == (xmlChar *)0x0) {
          local_68 = *(xmlChar **)((long)ctx + 0x118);
        }
        pxVar2 = xmlBuildURI(systemId,local_68);
        pxVar1->URI = pxVar2;
      }
    }
    else {
      xmlFatalErrMsg((xmlParserCtxtPtr)ctx,XML_ERR_ENTITY_PROCESSING,
                     "SAX.xmlSAX2EntityDecl(%s) called while not in subset\n",name,(xmlChar *)0x0);
    }
  }
  return;
}

Assistant:

void
xmlSAX2EntityDecl(void *ctx, const xmlChar *name, int type,
          const xmlChar *publicId, const xmlChar *systemId, xmlChar *content)
{
    xmlEntityPtr ent;
    xmlParserCtxtPtr ctxt = (xmlParserCtxtPtr) ctx;

    if (ctx == NULL) return;
#ifdef DEBUG_SAX
    xmlGenericError(xmlGenericErrorContext,
	    "SAX.xmlSAX2EntityDecl(%s, %d, %s, %s, %s)\n",
            name, type, publicId, systemId, content);
#endif
    if (ctxt->inSubset == 1) {
	ent = xmlAddDocEntity(ctxt->myDoc, name, type, publicId,
		              systemId, content);
	if ((ent == NULL) && (ctxt->pedantic))
	    xmlWarnMsg(ctxt, XML_WAR_ENTITY_REDEFINED,
	     "Entity(%s) already defined in the internal subset\n",
	               name);
	if ((ent != NULL) && (ent->URI == NULL) && (systemId != NULL)) {
	    xmlChar *URI;
	    const char *base = NULL;

	    if (ctxt->input != NULL)
		base = ctxt->input->filename;
	    if (base == NULL)
		base = ctxt->directory;

	    URI = xmlBuildURI(systemId, (const xmlChar *) base);
	    ent->URI = URI;
	}
    } else if (ctxt->inSubset == 2) {
	ent = xmlAddDtdEntity(ctxt->myDoc, name, type, publicId,
		              systemId, content);
	if ((ent == NULL) && (ctxt->pedantic) &&
	    (ctxt->sax != NULL) && (ctxt->sax->warning != NULL))
	    ctxt->sax->warning(ctxt->userData,
	     "Entity(%s) already defined in the external subset\n", name);
	if ((ent != NULL) && (ent->URI == NULL) && (systemId != NULL)) {
	    xmlChar *URI;
	    const char *base = NULL;

	    if (ctxt->input != NULL)
		base = ctxt->input->filename;
	    if (base == NULL)
		base = ctxt->directory;

	    URI = xmlBuildURI(systemId, (const xmlChar *) base);
	    ent->URI = URI;
	}
    } else {
	xmlFatalErrMsg(ctxt, XML_ERR_ENTITY_PROCESSING,
	               "SAX.xmlSAX2EntityDecl(%s) called while not in subset\n",
		       name, NULL);
    }
}